

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CollectorOutput.cpp
# Opt level: O0

void __thiscall
Test::CollectorOutput::printException
          (CollectorOutput *this,string *suiteName,string *methodName,string *argString,
          exception *ex)

{
  runtime_error *this_00;
  char *__s;
  allocator<char> local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  exception *local_30;
  exception *ex_local;
  string *argString_local;
  string *methodName_local;
  string *suiteName_local;
  CollectorOutput *this_local;
  
  local_30 = ex;
  ex_local = (exception *)argString;
  argString_local = methodName;
  methodName_local = suiteName;
  suiteName_local = (string *)this;
  if (this->currentMethod == (TestMethodInfo *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Invalid Test-Method!");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this->currentMethod->withSuccess = false;
  __s = (char *)(**(code **)(*(long *)ex + 0x10))();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,__s,&local_61);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->currentMethod->exceptionMessage,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  return;
}

Assistant:

void CollectorOutput::printException(const std::string &suiteName, const std::string &methodName,
    const std::string &argString, const std::exception &ex) {
  if (currentMethod == nullptr)
    throw std::runtime_error("Invalid Test-Method!");
  currentMethod->withSuccess = false;
  currentMethod->exceptionMessage = std::string(ex.what());
}